

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
TransferList(InnerMap *this,void **table,size_type index)

{
  Node *pNVar1;
  size_t sVar2;
  Node *node;
  iterator local_40;
  
  node = (Node *)table[index];
  do {
    pNVar1 = node->next;
    sVar2 = std::hash<google::protobuf::MapKey>::operator()
                      ((hash<google::protobuf::MapKey> *)this,(MapKey *)node);
    InsertUnique(&local_40,this,
                 (ulong)((int)this->num_buckets_ - 1U &
                        (uint)((sVar2 ^ this->seed_) * -0x61c8864680b583eb >> 0x20)),node);
    node = pNVar1;
  } while (pNVar1 != (Node *)0x0);
  return;
}

Assistant:

void TransferList(void* const* table, size_type index) {
      Node* node = static_cast<Node*>(table[index]);
      do {
        Node* next = node->next;
        InsertUnique(BucketNumber(node->kv.first), node);
        node = next;
      } while (node != nullptr);
    }